

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O0

TestSuite * create_named_test_suite_(char *name,char *filename,int line)

{
  TestSuite *pTVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  TestSuite *suite;
  
  pTVar1 = (TestSuite *)malloc(0x38);
  pTVar1->name = in_RDI;
  pTVar1->filename = in_RSI;
  pTVar1->line = in_EDX;
  pTVar1->tests = (UnitTest *)0x0;
  pTVar1->setup = do_nothing;
  pTVar1->teardown = do_nothing;
  pTVar1->size = 0;
  return pTVar1;
}

Assistant:

TestSuite *create_named_test_suite_(const char *name, const char *filename, int line) {
    TestSuite *suite = (TestSuite *)malloc(sizeof(TestSuite));
    suite->name = name;
    suite->filename = filename;
    suite->line = line;
    suite->tests = NULL;
    suite->setup = &do_nothing;
    suite->teardown = &do_nothing;
    suite->size = 0;
    return suite;
}